

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_statemach_act(connectdata *conn)

{
  anon_union_224_10_26c073a1_for_proto *pp;
  byte *pbVar1;
  char cVar2;
  ftpstate instate;
  curl_usessl cVar3;
  uint uVar4;
  curl_TimeCond cVar5;
  Curl_easy *pCVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  undefined8 uVar10;
  bool bVar11;
  byte bVar12;
  CURLcode CVar13;
  int iVar14;
  CURLcode CVar15;
  time_t tVar16;
  char *pcVar17;
  ushort **ppuVar18;
  char *pcVar19;
  long lVar20;
  int *piVar21;
  uint uVar22;
  ulong uVar24;
  ftpport fcmd;
  byte *pbVar25;
  char *pcVar26;
  int year;
  short local_194 [2];
  size_t nread;
  int ftpcode;
  int second;
  int minute;
  int hour;
  int day;
  int month;
  time_t secs;
  uint local_168;
  uint local_164;
  int local_160;
  int local_15c;
  int local_158;
  char timebuf [24];
  short *psVar23;
  
  pCVar6 = conn->data;
  nread = 0;
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar13 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar13;
  }
  CVar13 = ftp_readresp(conn->sock[0],&(pp->ftpc).pp,&ftpcode,&nread);
  if (CVar13 != CURLE_OK) {
    return CVar13;
  }
  if (ftpcode == 0) {
    return CURLE_OK;
  }
  instate = (conn->proto).ftpc.state;
  switch(instate) {
  case FTP_WAIT220:
    if (ftpcode != 0xdc) {
      if (ftpcode != 0xe6) {
        Curl_failf(pCVar6,"Got a %03d ftp-server response when 220 was expected",
                   (ulong)(uint)ftpcode);
        return CURLE_WEIRD_SERVER_REPLY;
      }
      CVar13 = ftp_state_loggedin(conn);
      return CVar13;
    }
    if (((pCVar6->set).use_ssl != CURLUSESSL_NONE) &&
       ((conn->ssl[0].use != true ||
        (((conn->bits).proxy_ssl_connected[0] == true && (conn->proxy_ssl[0].use == false)))))) {
      (conn->proto).ftpc.count3 = 0;
      uVar24 = (ulong)(pCVar6->set).ftpsslauth;
      if (2 < uVar24) {
        Curl_failf(pCVar6,"unsupported parameter to CURLOPT_FTPSSLAUTH: %d");
        return CURLE_UNKNOWN_OPTION;
      }
      iVar14 = *(int *)(&DAT_0055c110 + uVar24 * 4);
      lVar20 = *(long *)(&DAT_0055c120 + uVar24 * 8);
      (conn->proto).ftpc.count2 = *(int *)(&DAT_0055c104 + uVar24 * 4);
      (conn->proto).ftpc.count1 = iVar14;
      CVar13 = Curl_pp_sendf(&(pp->ftpc).pp,"AUTH %s",ftp_statemach_act::ftpauth + lVar20);
      if (CVar13 == CURLE_OK) {
        (conn->proto).ftpc.state = FTP_AUTH;
        return CURLE_OK;
      }
      return CVar13;
    }
    CVar15 = ftp_state_user(conn);
    goto joined_r0x004dd135;
  case FTP_AUTH:
    if ((ftpcode == 0x14e) || (ftpcode == 0xea)) {
      CVar13 = Curl_ssl_connect(conn,0);
      if (CVar13 != CURLE_OK) {
        return CVar13;
      }
      (conn->bits).ftp_use_data_ssl = false;
    }
    else {
      iVar14 = (conn->proto).ftpc.count3;
      if (iVar14 < 1) {
        (conn->proto).ftpc.count3 = iVar14 + 1;
        lVar20 = (long)(conn->proto).ftpc.count1 + (long)(conn->proto).ftpc.count2;
        (conn->proto).ftpc.count1 = (int)lVar20;
        CVar15 = Curl_pp_sendf(&(pp->ftpc).pp,"AUTH %s",ftp_statemach_act::ftpauth + lVar20);
        goto joined_r0x004dd135;
      }
      if (CURLUSESSL_TRY < (pCVar6->set).use_ssl) {
        return CURLE_USE_SSL_FAILED;
      }
    }
    CVar15 = ftp_state_user(conn);
    goto joined_r0x004dd135;
  case FTP_USER:
  case FTP_PASS:
    pCVar6 = conn->data;
    if (ftpcode == 0x14b) {
      if (instate == FTP_USER) {
        pcVar26 = *(char **)((long)(pCVar6->req).protop + 0x10);
        pcVar17 = "";
        if (pcVar26 != (char *)0x0) {
          pcVar17 = pcVar26;
        }
        CVar13 = Curl_pp_sendf(&(pp->ftpc).pp,"PASS %s",pcVar17);
        if (CVar13 != CURLE_OK) {
          return CVar13;
        }
        (conn->proto).ftpc.state = FTP_PASS;
        return CURLE_OK;
      }
LAB_004dcc12:
      if (((pCVar6->set).str[0xb] != (char *)0x0) &&
         ((pCVar6->state).ftp_trying_alternative == false)) {
        CVar13 = Curl_pp_sendf(&(pp->ftpc).pp,"%s");
        if (CVar13 != CURLE_OK) {
          return CVar13;
        }
        (conn->data->state).ftp_trying_alternative = true;
        (conn->proto).ftpc.state = FTP_USER;
        return CURLE_OK;
      }
      Curl_failf(pCVar6,"Access denied: %03d",(ulong)(uint)ftpcode);
    }
    else {
      if (ftpcode - 200U < 100) goto LAB_004dc5eb;
      if (ftpcode != 0x14c) goto LAB_004dcc12;
      if ((pCVar6->set).str[10] != (char *)0x0) {
        CVar13 = Curl_pp_sendf(&(pp->ftpc).pp,"ACCT %s");
        if (CVar13 != CURLE_OK) {
          return CVar13;
        }
        (conn->proto).ftpc.state = FTP_ACCT;
        return CURLE_OK;
      }
      Curl_failf(pCVar6,"ACCT requested but none available");
    }
    CVar13 = CURLE_LOGIN_DENIED;
    break;
  case FTP_ACCT:
    if (ftpcode != 0xe6) {
      Curl_failf(conn->data,"ACCT rejected by server: %03d",(ulong)(uint)ftpcode);
      return CURLE_FTP_WEIRD_PASS_REPLY;
    }
LAB_004dc5eb:
    CVar13 = ftp_state_loggedin(conn);
    break;
  case FTP_PBSZ:
    uVar10 = 0x50;
    if ((pCVar6->set).use_ssl == CURLUSESSL_CONTROL) {
      uVar10 = 0x43;
    }
    CVar13 = CURLE_OK;
    CVar15 = Curl_pp_sendf(&(pp->ftpc).pp,"PROT %c",uVar10);
    if (CVar15 != CURLE_OK) {
      return CVar15;
    }
    (conn->proto).ftpc.state = FTP_PROT;
    break;
  case FTP_PROT:
    cVar3 = (pCVar6->set).use_ssl;
    if (ftpcode - 200U < 100) {
      (conn->bits).ftp_use_data_ssl = cVar3 != CURLUSESSL_CONTROL;
    }
    else if (CURLUSESSL_CONTROL < cVar3) {
      return CURLE_USE_SSL_FAILED;
    }
    if ((pCVar6->set).ftp_ccc != CURLFTPSSL_CCC_NONE) {
      CVar13 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","CCC");
      if (CVar13 == CURLE_OK) {
        (conn->proto).ftpc.state = FTP_CCC;
        return CURLE_OK;
      }
      return CVar13;
    }
    goto LAB_004dcccc;
  case FTP_CCC:
    if ((ftpcode < 500) && (CVar13 = Curl_ssl_shutdown(conn,0), CVar13 != CURLE_OK)) {
      Curl_failf(conn->data,"Failed to clear the command channel (CCC)");
      return CVar13;
    }
LAB_004dcccc:
    CVar15 = ftp_state_pwd(conn);
    goto joined_r0x004dd135;
  case FTP_PWD:
    if (ftpcode == 0x101) {
      pcVar26 = (pCVar6->state).buffer;
      lVar20 = (pCVar6->set).buffer_size;
      pcVar17 = (char *)(*Curl_cmalloc)(nread + 1);
      if (pcVar17 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      for (pcVar26 = pcVar26 + 4; cVar2 = *pcVar26, pcVar19 = pcVar17,
          pcVar26 < (pCVar6->state).buffer + lVar20; pcVar26 = pcVar26 + 1) {
        if ((cVar2 == '\0') || (cVar2 == '\n')) goto LAB_004dd262;
        if (cVar2 == '\"') goto LAB_004dd237;
      }
      if (cVar2 == '\"') {
LAB_004dd237:
        cVar2 = pcVar26[1];
        if (cVar2 != '\"') {
          if (cVar2 == '\0') goto LAB_004dd317;
          pcVar26 = pcVar26 + 1;
LAB_004dd25b:
          *pcVar19 = cVar2;
          pcVar19 = pcVar19 + 1;
          goto LAB_004dd237;
        }
        if (pcVar26[2] == '\"') {
          pcVar26 = pcVar26 + 2;
          goto LAB_004dd25b;
        }
        *pcVar19 = '\0';
LAB_004dd317:
        if (((conn->proto).ftpc.server_os == (char *)0x0) && (*pcVar17 != '/')) {
          CVar13 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","SYST");
          if (CVar13 == CURLE_OK) {
            (*Curl_cfree)((conn->proto).ftpc.entrypath);
            (conn->proto).ftpc.entrypath = pcVar17;
            Curl_infof(pCVar6,"Entry path is \'%s\'\n",pcVar17);
            (pCVar6->state).most_recent_ftp_entrypath = (conn->proto).ftpc.entrypath;
            (conn->proto).ftpc.state = FTP_SYST;
            return CURLE_OK;
          }
          goto LAB_004dcf04;
        }
        (*Curl_cfree)((conn->proto).ftpc.entrypath);
        (conn->proto).ftpc.entrypath = pcVar17;
        Curl_infof(pCVar6,"Entry path is \'%s\'\n",pcVar17);
        (pCVar6->state).most_recent_ftp_entrypath = (conn->proto).ftpc.entrypath;
      }
      else {
LAB_004dd262:
        (*Curl_cfree)(pcVar17);
        Curl_infof(pCVar6,"Failed to figure out path\n");
      }
    }
  default:
switchD_004dc27d_default:
    (conn->proto).ftpc.state = FTP_STOP;
    CVar13 = CURLE_OK;
    break;
  case FTP_SYST:
    if (ftpcode == 0xd7) {
      pcVar26 = (pCVar6->state).buffer;
      pcVar17 = (char *)(*Curl_cmalloc)(nread + 1);
      if (pcVar17 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pbVar25 = (byte *)(pcVar26 + 4);
      do {
        bVar12 = *pbVar25;
        pbVar25 = pbVar25 + 1;
      } while (bVar12 == 0x20);
      lVar20 = 0;
      while ((bVar12 & 0xdf) != 0) {
        pcVar17[lVar20] = bVar12;
        pbVar1 = pbVar25 + lVar20;
        lVar20 = lVar20 + 1;
        bVar12 = *pbVar1;
      }
      pcVar17[lVar20] = '\0';
      iVar14 = Curl_strcasecompare(pcVar17,"OS/400");
      if (iVar14 != 0) {
        CVar13 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","SITE NAMEFMT 1");
        if (CVar13 == CURLE_OK) {
          (*Curl_cfree)((conn->proto).ftpc.server_os);
          (conn->proto).ftpc.server_os = pcVar17;
          (conn->proto).ftpc.state = FTP_NAMEFMT;
          return CURLE_OK;
        }
LAB_004dcf04:
        (*Curl_cfree)(pcVar17);
        return CVar13;
      }
      (*Curl_cfree)((conn->proto).ftpc.server_os);
      (conn->proto).ftpc.server_os = pcVar17;
    }
    goto switchD_004dc27d_default;
  case FTP_NAMEFMT:
    if (ftpcode == 0xfa) {
      ftp_state_pwd(conn);
      return CURLE_OK;
    }
    goto switchD_004dc27d_default;
  case FTP_QUOTE:
  case FTP_RETR_PREQUOTE:
  case FTP_STOR_PREQUOTE:
  case FTP_POSTQUOTE:
    if ((399 < ftpcode) && ((conn->proto).ftpc.count2 == 0)) {
      Curl_failf(conn->data,"QUOT command failed with %03d",(ulong)(uint)ftpcode);
      return CURLE_QUOTE_ERROR;
    }
    CVar15 = ftp_state_quote(conn,false,instate);
    goto joined_r0x004dd135;
  case FTP_CWD:
    if (99 < ftpcode - 200U) {
      if ((((conn->data->set).ftp_create_missing_dirs != 0) &&
          (lVar20 = (long)(conn->proto).ftpc.count1, lVar20 != 0)) &&
         ((conn->proto).ftpc.count2 == 0)) {
        (conn->proto).ftpc.count2 = 1;
        CVar13 = Curl_pp_sendf(&(pp->ftpc).pp,"MKD %s",
                               *(undefined8 *)(((conn->proto).pop3c.eob - 8) + lVar20 * 8));
        if (CVar13 == CURLE_OK) {
          (conn->proto).ftpc.state = FTP_MKD;
          return CURLE_OK;
        }
        return CVar13;
      }
      Curl_failf(pCVar6,"Server denied you to change to the given directory");
      (conn->proto).ftpc.cwdfail = true;
      return CURLE_REMOTE_ACCESS_DENIED;
    }
    (conn->proto).ftpc.count2 = 0;
    iVar14 = (conn->proto).ftpc.count1;
    (conn->proto).ftpc.count1 = iVar14 + 1;
    if (iVar14 < (conn->proto).ftpc.dirdepth) {
      pcVar26 = (conn->proto).ftpc.dirs[iVar14];
      goto LAB_004dca94;
    }
    CVar15 = ftp_state_mdtm(conn);
    goto joined_r0x004dd135;
  case FTP_MKD:
    if (99 < ftpcode - 200U) {
      piVar21 = &(conn->proto).ftpc.count3;
      iVar14 = *piVar21;
      *piVar21 = *piVar21 + -1;
      if (iVar14 == 0) {
        Curl_failf(pCVar6,"Failed to MKD dir: %03d",(ulong)(uint)ftpcode);
        return CURLE_REMOTE_ACCESS_DENIED;
      }
    }
    (conn->proto).ftpc.state = FTP_CWD;
    pcVar26 = *(char **)(((conn->proto).pop3c.eob - 8) + (long)(conn->proto).ftpc.count1 * 8);
LAB_004dca94:
    CVar15 = Curl_pp_sendf(&(pp->ftpc).pp,"CWD %s",pcVar26);
joined_r0x004dd135:
    CVar13 = CURLE_OK;
    if (CVar15 != CURLE_OK) {
      return CVar15;
    }
    break;
  case FTP_MDTM:
    pCVar6 = conn->data;
    pvVar7 = (pCVar6->req).protop;
    if (ftpcode == 0x226) {
      bVar11 = false;
      Curl_failf(pCVar6,"Given file does not exist");
      CVar13 = CURLE_FTP_COULDNT_RETR_FILE;
    }
    else {
      if (ftpcode == 0xd5) {
        iVar14 = __isoc99_sscanf((pCVar6->state).buffer + 4,"%04d%02d%02d%02d%02d%02d",&year,&month,
                                 &day,&hour,&minute,&second);
        if (iVar14 == 6) {
          secs = time((time_t *)0x0);
          curl_msnprintf(timebuf,0x18,"%04d%02d%02d %02d:%02d:%02d GMT",(ulong)(uint)year,
                         (ulong)(uint)month,(ulong)(uint)day,(ulong)(uint)hour,(ulong)(uint)minute,
                         (ulong)(uint)second);
          tVar16 = curl_getdate(timebuf,&secs);
          (pCVar6->info).filetime = tVar16;
        }
        if (((((pCVar6->set).opt_no_body == true) && ((conn->proto).ftpc.file != (char *)0x0)) &&
            ((pCVar6->set).get_filetime == true)) && (lVar20 = (pCVar6->info).filetime, -1 < lVar20)
           ) {
          CVar13 = Curl_gmtime(lVar20,(tm *)&secs);
          if (CVar13 != CURLE_OK) {
            return CVar13;
          }
          iVar14 = 6;
          if (local_158 != 0) {
            iVar14 = local_158 + -1;
          }
          curl_msnprintf(timebuf,0x80,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                         Curl_wkday[iVar14],(ulong)local_164,Curl_month[local_160],
                         (ulong)(local_15c + 0x76c),(ulong)local_168,(ulong)secs >> 0x20,
                         secs & 0xffffffff);
          CVar13 = Curl_client_write(conn,3,timebuf,0);
          if (CVar13 != CURLE_OK) {
            return CVar13;
          }
        }
      }
      else {
        Curl_infof(pCVar6,"unsupported MDTM reply format\n");
      }
      CVar13 = CURLE_OK;
      bVar11 = true;
    }
    cVar5 = (pCVar6->set).timecondition;
    if (cVar5 != CURL_TIMECOND_NONE) {
      uVar24 = (pCVar6->info).filetime;
      if (((long)uVar24 < 1) || (uVar9 = (pCVar6->set).timevalue, (long)uVar9 < 1)) {
        Curl_infof(pCVar6,"Skipping time comparison\n");
      }
      else if (cVar5 == CURL_TIMECOND_IFUNMODSINCE) {
        if (uVar9 < uVar24) {
          pcVar26 = "The requested document is not old enough\n";
LAB_004dd1dd:
          Curl_infof(pCVar6,pcVar26);
          *(undefined4 *)((long)pvVar7 + 0x18) = 2;
          (pCVar6->info).timecond = true;
          goto switchD_004dc27d_default;
        }
      }
      else if (uVar24 <= uVar9) {
        pcVar26 = "The requested document is not new enough\n";
        goto LAB_004dd1dd;
      }
    }
    if (bVar11) {
      CVar13 = ftp_state_type(conn);
    }
    break;
  case FTP_TYPE:
  case FTP_LIST_TYPE:
  case FTP_RETR_TYPE:
  case FTP_STOR_TYPE:
    CVar13 = ftp_state_type_resp(conn,ftpcode,instate);
    break;
  case FTP_SIZE:
  case FTP_RETR_SIZE:
  case FTP_STOR_SIZE:
    pCVar6 = conn->data;
    if (ftpcode == 0xd5) {
      lVar20 = strtol((pCVar6->state).buffer + 4,(char **)0x0,0);
    }
    else {
      lVar20 = -1;
    }
    if (instate == FTP_STOR_SIZE) {
      (pCVar6->state).resume_from = lVar20;
      CVar13 = ftp_state_ul_setup(conn,true);
    }
    else if (instate == FTP_RETR_SIZE) {
      Curl_pgrsSetDownloadSize(pCVar6,lVar20);
      CVar13 = ftp_state_retr(conn,lVar20);
    }
    else {
      if (lVar20 != -1) {
        curl_msnprintf(timebuf,0x80,"Content-Length: %ld\r\n");
        CVar13 = Curl_client_write(conn,3,timebuf,0);
        if (CVar13 != CURLE_OK) {
          return CVar13;
        }
      }
      Curl_pgrsSetDownloadSize(pCVar6,lVar20);
      CVar13 = ftp_state_rest(conn);
    }
    break;
  case FTP_REST:
  case FTP_RETR_REST:
    if (instate == FTP_RETR_REST) {
      if (ftpcode == 0x15e) {
        CVar13 = Curl_pp_sendf(&(pp->ftpc).pp,"RETR %s",(conn->proto).ftpc.file);
        if (CVar13 == CURLE_OK) {
          (conn->proto).ftpc.state = FTP_RETR;
          CVar13 = CURLE_OK;
        }
      }
      else {
        Curl_failf(conn->data,"Couldn\'t use REST");
        CVar13 = CURLE_FTP_COULDNT_USE_REST;
      }
    }
    else {
      if (ftpcode == 0x15e) {
        builtin_strncpy(timebuf,"Accept-ranges: bytes\r\n",0x17);
        timebuf[0x17] = '\0';
        CVar13 = Curl_client_write(conn,3,timebuf,0);
        if (CVar13 != CURLE_OK) {
          return CVar13;
        }
      }
      CVar13 = ftp_state_prepare_transfer(conn);
    }
    break;
  case FTP_PORT:
    pCVar6 = conn->data;
    if (ftpcode - 200U < 100) {
      Curl_infof(pCVar6,"Connect data stream actively\n");
      (conn->proto).ftpc.state = FTP_STOP;
      CVar13 = ftp_dophase_done(conn,false);
    }
    else {
      iVar14 = (conn->proto).ftpc.count1;
      if (iVar14 == 0) {
        Curl_infof(pCVar6,"disabling EPRT usage\n");
        (conn->bits).ftp_use_eprt = false;
        fcmd = PORT;
      }
      else {
        fcmd = iVar14 + PORT;
        if (fcmd == DONE) {
          Curl_failf(pCVar6,"Failed to do PORT");
          return CURLE_FTP_PORT_FAILED;
        }
      }
      CVar13 = ftp_state_use_port(conn,fcmd);
    }
    break;
  case FTP_PRET:
    if (ftpcode != 200) {
      Curl_failf(pCVar6,"PRET command not accepted: %03d",(ulong)(uint)ftpcode);
      return CURLE_FTP_PRET_FAILED;
    }
    CVar13 = ftp_state_use_pasv(conn);
    break;
  case FTP_PASV:
    pCVar6 = conn->data;
    secs = 0;
    pcVar26 = (pCVar6->state).buffer + 4;
    (*Curl_cfree)((conn->proto).ftpc.newhost);
    (conn->proto).ftpc.newhost = (char *)0x0;
    uVar4 = (conn->proto).ftpc.count1;
    if (ftpcode != 0xe5 || uVar4 != 0) {
      piVar21 = (int *)(ulong)(uVar4 ^ 1);
      uVar22 = ftpcode ^ 0xe3U | uVar4 ^ 1;
      psVar23 = (short *)(ulong)uVar22;
      if (uVar22 == 0) {
        do {
          if (*pcVar26 == '\0') {
LAB_004dd1b1:
            Curl_failf(pCVar6,"Couldn\'t interpret the 227-response",psVar23,piVar21);
            return CURLE_FTP_WEIRD_227_FORMAT;
          }
          psVar23 = local_194;
          piVar21 = &year;
          iVar14 = __isoc99_sscanf(pcVar26,"%d,%d,%d,%d,%d,%d",timebuf,timebuf + 4,timebuf + 8,
                                   timebuf + 0xc);
          if (iVar14 == 6) {
            if (*pcVar26 != '\0') {
              if ((pCVar6->set).ftp_skip_ip == true) {
                Curl_infof(pCVar6,"Skip %d.%d.%d.%d for data connection, re-use %s instead\n");
                if (((conn->bits).tunnel_proxy == false) && ((conn->bits).socksproxy != true)) {
                  pcVar26 = conn->ip_addr_str;
                }
                else {
                  pcVar26 = (conn->host).name;
                }
                pcVar26 = (*Curl_cstrdup)(pcVar26);
              }
              else {
                pcVar26 = curl_maprintf("%d.%d.%d.%d",timebuf._0_8_ & 0xffffffff,
                                        (ulong)timebuf._0_8_ >> 0x20,timebuf._8_8_ & 0xffffffff,
                                        (ulong)timebuf._8_8_ >> 0x20);
              }
              (conn->proto).ftpc.newhost = pcVar26;
              if (pcVar26 == (char *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
              (conn->proto).ftpc.newport = (short)(year << 8) + local_194[0];
              goto LAB_004dd498;
            }
            goto LAB_004dd1b1;
          }
          pcVar26 = pcVar26 + 1;
        } while( true );
      }
      if (uVar4 != 0) {
        Curl_failf(pCVar6,"Bad PASV/EPSV response: %03d",(ulong)(uint)ftpcode);
        return CURLE_FTP_WEIRD_PASV_REPLY;
      }
LAB_004dd565:
      CVar13 = ftp_epsv_disable(conn);
      return CVar13;
    }
    pcVar26 = strchr(pcVar26,0x28);
    if ((pcVar26 != (char *)0x0) &&
       (iVar14 = __isoc99_sscanf(pcVar26 + 1,"%c%c%c%u%c",&year,(long)&year + 1,(long)&year + 2,
                                 timebuf,(long)&year + 3), iVar14 == 5)) {
      lVar20 = 1;
      do {
        if (lVar20 == 4) {
          if ((uint)timebuf._0_4_ < 0x10000) {
            (conn->proto).ftpc.newport = (unsigned_short)timebuf._0_4_;
            if (((conn->bits).tunnel_proxy == false) && ((conn->bits).socksproxy != true)) {
              pcVar26 = conn->ip_addr_str;
            }
            else {
              pcVar26 = (conn->host).name;
            }
            pcVar26 = (*Curl_cstrdup)(pcVar26);
            (conn->proto).ftpc.newhost = pcVar26;
            if (pcVar26 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
LAB_004dd498:
            if ((conn->bits).proxy == true) {
              pcVar26 = *(char **)((long)&(conn->socks_proxy).host.name +
                                  (ulong)(((conn->bits).socksproxy ^ 1) << 6));
              Curl_resolv(conn,pcVar26,(int)conn->port,(Curl_dns_entry **)&secs);
              uVar24 = conn->port;
              if (secs == 0) {
                Curl_failf(pCVar6,"Can\'t resolve proxy host %s:%hu",pcVar26,uVar24 & 0xffff);
                return CURLE_COULDNT_RESOLVE_PROXY;
              }
            }
            else {
              Curl_resolv(conn,pcVar26,(uint)(conn->proto).ftpc.newport,(Curl_dns_entry **)&secs);
              uVar24 = (ulong)(conn->proto).ftpc.newport;
              if (secs == 0) {
                Curl_failf(pCVar6,"Can\'t resolve new host %s:%hu",(conn->proto).ftpc.newhost,uVar24
                          );
                return CURLE_FTP_CANT_GET_HOST;
              }
            }
            (conn->bits).tcpconnect[1] = false;
            CVar13 = Curl_connecthost(conn,(Curl_dns_entry *)secs);
            if (CVar13 == CURLE_OK) {
              if ((pCVar6->set).verbose == true) {
                pcVar26 = (conn->proto).ftpc.newhost;
                Curl_printable_address(*(Curl_addrinfo **)secs,timebuf,0x100);
                Curl_infof(conn->data,"Connecting to %s (%s) port %d\n",pcVar26,timebuf,
                           uVar24 & 0xffff);
              }
              Curl_resolv_unlock(pCVar6,(Curl_dns_entry *)secs);
              (*Curl_cfree)(conn->secondaryhostname);
              conn->secondaryhostname = (char *)0x0;
              conn->secondary_port = (conn->proto).ftpc.newport;
              pcVar26 = (*Curl_cstrdup)((conn->proto).ftpc.newhost);
              conn->secondaryhostname = pcVar26;
              if (pcVar26 == (char *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
              (conn->bits).do_more = true;
              (conn->proto).ftpc.state = FTP_STOP;
              return CURLE_OK;
            }
            Curl_resolv_unlock(pCVar6,(Curl_dns_entry *)secs);
            if (ftpcode != 0xe5) {
              return CVar13;
            }
            if ((conn->proto).ftpc.count1 != 0) {
              return CVar13;
            }
            goto LAB_004dd565;
          }
          goto LAB_004dd290;
        }
        lVar8 = lVar20 + -4;
        lVar20 = lVar20 + 1;
      } while (*(char *)((long)local_194 + lVar8) == (char)year);
      if (0xffff < (uint)timebuf._0_4_) {
LAB_004dd290:
        pcVar26 = "Illegal port number in EPSV reply";
        goto LAB_004dca68;
      }
    }
    pcVar26 = "Weirdly formatted EPSV reply";
LAB_004dca68:
    Curl_failf(pCVar6,pcVar26);
    return CURLE_FTP_WEIRD_PASV_REPLY;
  case FTP_LIST:
  case FTP_RETR:
    pCVar6 = conn->data;
    pvVar7 = (pCVar6->req).protop;
    if ((ftpcode == 0x96) || (ftpcode == 0x7d)) {
      if ((instate == FTP_LIST) ||
         (((pCVar6->set).prefer_ascii != false || (0 < *(long *)((long)pvVar7 + 0x20))))) {
        lVar20 = -1;
        if (-1 < *(long *)((long)pvVar7 + 0x20)) {
          lVar20 = *(long *)((long)pvVar7 + 0x20);
        }
      }
      else {
        pcVar26 = (pCVar6->state).buffer;
        pcVar17 = strstr(pcVar26," bytes");
        lVar20 = -1;
        if (pcVar17 != (char *)0x0) {
          pcVar26 = pcVar26 + (2 - (long)pcVar17);
          for (; (pcVar26 != (char *)0x0 && (bVar12 = pcVar17[-1], (ulong)bVar12 != 0x28));
              pcVar17 = pcVar17 + -1) {
            ppuVar18 = __ctype_b_loc();
            lVar20 = -1;
            if ((*(byte *)((long)*ppuVar18 + (ulong)bVar12 * 2 + 1) & 8) == 0) goto LAB_004dc3d5;
            pcVar26 = pcVar26 + 1;
          }
          lVar20 = strtol(pcVar17,(char **)0x0,0);
        }
      }
LAB_004dc3d5:
      lVar8 = (pCVar6->req).maxdownload;
      if (lVar8 < 1 || lVar20 <= lVar8) {
        if ((instate != FTP_LIST) && ((pCVar6->set).prefer_ascii != false)) {
          lVar20 = -1;
        }
      }
      else {
        (pCVar6->req).size = lVar8;
        lVar20 = lVar8;
      }
      Curl_infof(pCVar6,"Maxdownload = %ld\n");
      if (instate != FTP_LIST) {
        Curl_infof(pCVar6,"Getting file with size: %ld\n",lVar20);
      }
      (conn->proto).ftpc.state_saved = instate;
      (conn->proto).ftpc.retr_size_saved = lVar20;
      if ((pCVar6->set).ftp_use_port == true) {
        CVar13 = AllowServerConnect(conn,(_Bool *)timebuf);
        if (CVar13 != CURLE_OK) {
          return CVar13;
        }
        if (timebuf[0] == '\0') {
          Curl_infof(pCVar6,"Data conn was not available immediately\n");
          (conn->proto).ftpc.state = FTP_STOP;
          (conn->proto).ftpc.wait_data_conn = true;
        }
        return CURLE_OK;
      }
      goto LAB_004dcd35;
    }
    if (ftpcode != 0x1c2 || instate != FTP_LIST) {
      Curl_failf(pCVar6,"RETR response: %03d",(ulong)(uint)ftpcode);
      if (ftpcode != 0x226 || instate != FTP_RETR) {
        return CURLE_FTP_COULDNT_RETR_FILE;
      }
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
    *(undefined4 *)((long)pvVar7 + 0x18) = 2;
    goto switchD_004dc27d_default;
  case FTP_STOR:
    pCVar6 = conn->data;
    if (399 < ftpcode) {
      Curl_failf(pCVar6,"Failed FTP upload: %0d",(ulong)(uint)ftpcode);
      (conn->proto).ftpc.state = FTP_STOP;
      return CURLE_UPLOAD_FAILED;
    }
    (conn->proto).ftpc.state_saved = FTP_STOR;
    if ((pCVar6->set).ftp_use_port == true) {
      (conn->proto).ftpc.state = FTP_STOP;
      CVar13 = AllowServerConnect(conn,(_Bool *)timebuf);
      if (CVar13 != CURLE_OK) {
        return CVar13;
      }
      if (timebuf[0] != '\0') {
        return CURLE_OK;
      }
      Curl_infof(pCVar6,"Data conn was not available immediately\n");
      (conn->proto).ftpc.wait_data_conn = true;
      return CURLE_OK;
    }
LAB_004dcd35:
    CVar13 = InitiateTransfer(conn);
  }
  return CVar13;
}

Assistant:

static CURLcode ftp_statemach_act(struct connectdata *conn)
{
  CURLcode result;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  struct Curl_easy *data=conn->data;
  int ftpcode;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  static const char ftpauth[][4]  = { "SSL", "TLS" };
  size_t nread = 0;

  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  result = ftp_readresp(sock, pp, &ftpcode, &nread);
  if(result)
    return result;

  if(ftpcode) {
    /* we have now received a full FTP server response */
    switch(ftpc->state) {
    case FTP_WAIT220:
      if(ftpcode == 230)
        /* 230 User logged in - already! */
        return ftp_state_user_resp(conn, ftpcode, ftpc->state);
      else if(ftpcode != 220) {
        failf(data, "Got a %03d ftp-server response when 220 was expected",
              ftpcode);
        return CURLE_WEIRD_SERVER_REPLY;
      }

      /* We have received a 220 response fine, now we proceed. */
#ifdef HAVE_GSSAPI
      if(data->set.krb) {
        /* If not anonymous login, try a secure login. Note that this
           procedure is still BLOCKING. */

        Curl_sec_request_prot(conn, "private");
        /* We set private first as default, in case the line below fails to
           set a valid level */
        Curl_sec_request_prot(conn, data->set.str[STRING_KRB_LEVEL]);

        if(Curl_sec_login(conn))
          infof(data, "Logging in with password in cleartext!\n");
        else
          infof(data, "Authentication successful\n");
      }
#endif

      if(data->set.use_ssl &&
         (!conn->ssl[FIRSTSOCKET].use ||
          (conn->bits.proxy_ssl_connected[FIRSTSOCKET] &&
           !conn->proxy_ssl[FIRSTSOCKET].use))) {
        /* We don't have a SSL/TLS connection yet, but FTPS is
           requested. Try a FTPS connection now */

        ftpc->count3=0;
        switch(data->set.ftpsslauth) {
        case CURLFTPAUTH_DEFAULT:
        case CURLFTPAUTH_SSL:
          ftpc->count2 = 1; /* add one to get next */
          ftpc->count1 = 0;
          break;
        case CURLFTPAUTH_TLS:
          ftpc->count2 = -1; /* subtract one to get next */
          ftpc->count1 = 1;
          break;
        default:
          failf(data, "unsupported parameter to CURLOPT_FTPSSLAUTH: %d",
                (int)data->set.ftpsslauth);
          return CURLE_UNKNOWN_OPTION; /* we don't know what to do */
        }
        PPSENDF(&ftpc->pp, "AUTH %s", ftpauth[ftpc->count1]);
        state(conn, FTP_AUTH);
      }
      else {
        result = ftp_state_user(conn);
        if(result)
          return result;
      }

      break;

    case FTP_AUTH:
      /* we have gotten the response to a previous AUTH command */

      /* RFC2228 (page 5) says:
       *
       * If the server is willing to accept the named security mechanism,
       * and does not require any security data, it must respond with
       * reply code 234/334.
       */

      if((ftpcode == 234) || (ftpcode == 334)) {
        /* Curl_ssl_connect is BLOCKING */
        result = Curl_ssl_connect(conn, FIRSTSOCKET);
        if(!result) {
          conn->bits.ftp_use_data_ssl = FALSE; /* clear-text data */
          result = ftp_state_user(conn);
        }
      }
      else if(ftpc->count3 < 1) {
        ftpc->count3++;
        ftpc->count1 += ftpc->count2; /* get next attempt */
        result = Curl_pp_sendf(&ftpc->pp, "AUTH %s", ftpauth[ftpc->count1]);
        /* remain in this same state */
      }
      else {
        if(data->set.use_ssl > CURLUSESSL_TRY)
          /* we failed and CURLUSESSL_CONTROL or CURLUSESSL_ALL is set */
          result = CURLE_USE_SSL_FAILED;
        else
          /* ignore the failure and continue */
          result = ftp_state_user(conn);
      }

      if(result)
        return result;
      break;

    case FTP_USER:
    case FTP_PASS:
      result = ftp_state_user_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_ACCT:
      result = ftp_state_acct_resp(conn, ftpcode);
      break;

    case FTP_PBSZ:
      PPSENDF(&ftpc->pp, "PROT %c",
              data->set.use_ssl == CURLUSESSL_CONTROL ? 'C' : 'P');
      state(conn, FTP_PROT);

      break;

    case FTP_PROT:
      if(ftpcode/100 == 2)
        /* We have enabled SSL for the data connection! */
        conn->bits.ftp_use_data_ssl =
          (data->set.use_ssl != CURLUSESSL_CONTROL) ? TRUE : FALSE;
      /* FTP servers typically responds with 500 if they decide to reject
         our 'P' request */
      else if(data->set.use_ssl > CURLUSESSL_CONTROL)
        /* we failed and bails out */
        return CURLE_USE_SSL_FAILED;

      if(data->set.ftp_ccc) {
        /* CCC - Clear Command Channel
         */
        PPSENDF(&ftpc->pp, "%s", "CCC");
        state(conn, FTP_CCC);
      }
      else {
        result = ftp_state_pwd(conn);
        if(result)
          return result;
      }
      break;

    case FTP_CCC:
      if(ftpcode < 500) {
        /* First shut down the SSL layer (note: this call will block) */
        result = Curl_ssl_shutdown(conn, FIRSTSOCKET);

        if(result) {
          failf(conn->data, "Failed to clear the command channel (CCC)");
          return result;
        }
      }

      /* Then continue as normal */
      result = ftp_state_pwd(conn);
      if(result)
        return result;
      break;

    case FTP_PWD:
      if(ftpcode == 257) {
        char *ptr=&data->state.buffer[4];  /* start on the first letter */
        const size_t buf_size = data->set.buffer_size;
        char *dir;
        char *store;

        dir = malloc(nread + 1);
        if(!dir)
          return CURLE_OUT_OF_MEMORY;

        /* Reply format is like
           257<space>[rubbish]"<directory-name>"<space><commentary> and the
           RFC959 says

           The directory name can contain any character; embedded
           double-quotes should be escaped by double-quotes (the
           "quote-doubling" convention).
        */

        /* scan for the first double-quote for non-standard responses */
        while(ptr < &data->state.buffer[buf_size]
              && *ptr != '\n' && *ptr != '\0' && *ptr != '"')
          ptr++;

        if('\"' == *ptr) {
          /* it started good */
          ptr++;
          for(store = dir; *ptr;) {
            if('\"' == *ptr) {
              if('\"' == ptr[1]) {
                /* "quote-doubling" */
                *store = ptr[1];
                ptr++;
              }
              else {
                /* end of path */
                *store = '\0'; /* zero terminate */
                break; /* get out of this loop */
              }
            }
            else
              *store = *ptr;
            store++;
            ptr++;
          }

          /* If the path name does not look like an absolute path (i.e.: it
             does not start with a '/'), we probably need some server-dependent
             adjustments. For example, this is the case when connecting to
             an OS400 FTP server: this server supports two name syntaxes,
             the default one being incompatible with standard paths. In
             addition, this server switches automatically to the regular path
             syntax when one is encountered in a command: this results in
             having an entrypath in the wrong syntax when later used in CWD.
               The method used here is to check the server OS: we do it only
             if the path name looks strange to minimize overhead on other
             systems. */

          if(!ftpc->server_os && dir[0] != '/') {

            result = Curl_pp_sendf(&ftpc->pp, "%s", "SYST");
            if(result) {
              free(dir);
              return result;
            }
            Curl_safefree(ftpc->entrypath);
            ftpc->entrypath = dir; /* remember this */
            infof(data, "Entry path is '%s'\n", ftpc->entrypath);
            /* also save it where getinfo can access it: */
            data->state.most_recent_ftp_entrypath = ftpc->entrypath;
            state(conn, FTP_SYST);
            break;
          }

          Curl_safefree(ftpc->entrypath);
          ftpc->entrypath = dir; /* remember this */
          infof(data, "Entry path is '%s'\n", ftpc->entrypath);
          /* also save it where getinfo can access it: */
          data->state.most_recent_ftp_entrypath = ftpc->entrypath;
        }
        else {
          /* couldn't get the path */
          free(dir);
          infof(data, "Failed to figure out path\n");
        }
      }
      state(conn, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE\n"));
      break;

    case FTP_SYST:
      if(ftpcode == 215) {
        char *ptr=&data->state.buffer[4];  /* start on the first letter */
        char *os;
        char *store;

        os = malloc(nread + 1);
        if(!os)
          return CURLE_OUT_OF_MEMORY;

        /* Reply format is like
           215<space><OS-name><space><commentary>
        */
        while(*ptr == ' ')
          ptr++;
        for(store = os; *ptr && *ptr != ' ';)
          *store++ = *ptr++;
        *store = '\0'; /* zero terminate */

        /* Check for special servers here. */

        if(strcasecompare(os, "OS/400")) {
          /* Force OS400 name format 1. */
          result = Curl_pp_sendf(&ftpc->pp, "%s", "SITE NAMEFMT 1");
          if(result) {
            free(os);
            return result;
          }
          /* remember target server OS */
          Curl_safefree(ftpc->server_os);
          ftpc->server_os = os;
          state(conn, FTP_NAMEFMT);
          break;
        }
        /* Nothing special for the target server. */
        /* remember target server OS */
        Curl_safefree(ftpc->server_os);
        ftpc->server_os = os;
      }
      else {
        /* Cannot identify server OS. Continue anyway and cross fingers. */
      }

      state(conn, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE\n"));
      break;

    case FTP_NAMEFMT:
      if(ftpcode == 250) {
        /* Name format change successful: reload initial path. */
        ftp_state_pwd(conn);
        break;
      }

      state(conn, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE\n"));
      break;

    case FTP_QUOTE:
    case FTP_POSTQUOTE:
    case FTP_RETR_PREQUOTE:
    case FTP_STOR_PREQUOTE:
      if((ftpcode >= 400) && !ftpc->count2) {
        /* failure response code, and not allowed to fail */
        failf(conn->data, "QUOT command failed with %03d", ftpcode);
        return CURLE_QUOTE_ERROR;
      }
      result = ftp_state_quote(conn, FALSE, ftpc->state);
      if(result)
        return result;

      break;

    case FTP_CWD:
      if(ftpcode/100 != 2) {
        /* failure to CWD there */
        if(conn->data->set.ftp_create_missing_dirs &&
           ftpc->count1 && !ftpc->count2) {
          /* try making it */
          ftpc->count2++; /* counter to prevent CWD-MKD loops */
          PPSENDF(&ftpc->pp, "MKD %s", ftpc->dirs[ftpc->count1 - 1]);
          state(conn, FTP_MKD);
        }
        else {
          /* return failure */
          failf(data, "Server denied you to change to the given directory");
          ftpc->cwdfail = TRUE; /* don't remember this path as we failed
                                   to enter it */
          return CURLE_REMOTE_ACCESS_DENIED;
        }
      }
      else {
        /* success */
        ftpc->count2=0;
        if(++ftpc->count1 <= ftpc->dirdepth) {
          /* send next CWD */
          PPSENDF(&ftpc->pp, "CWD %s", ftpc->dirs[ftpc->count1 - 1]);
        }
        else {
          result = ftp_state_mdtm(conn);
          if(result)
            return result;
        }
      }
      break;

    case FTP_MKD:
      if((ftpcode/100 != 2) && !ftpc->count3--) {
        /* failure to MKD the dir */
        failf(data, "Failed to MKD dir: %03d", ftpcode);
        return CURLE_REMOTE_ACCESS_DENIED;
      }
      state(conn, FTP_CWD);
      /* send CWD */
      PPSENDF(&ftpc->pp, "CWD %s", ftpc->dirs[ftpc->count1 - 1]);
      break;

    case FTP_MDTM:
      result = ftp_state_mdtm_resp(conn, ftpcode);
      break;

    case FTP_TYPE:
    case FTP_LIST_TYPE:
    case FTP_RETR_TYPE:
    case FTP_STOR_TYPE:
      result = ftp_state_type_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_SIZE:
    case FTP_RETR_SIZE:
    case FTP_STOR_SIZE:
      result = ftp_state_size_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_REST:
    case FTP_RETR_REST:
      result = ftp_state_rest_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_PRET:
      if(ftpcode != 200) {
        /* there only is this one standard OK return code. */
        failf(data, "PRET command not accepted: %03d", ftpcode);
        return CURLE_FTP_PRET_FAILED;
      }
      result = ftp_state_use_pasv(conn);
      break;

    case FTP_PASV:
      result = ftp_state_pasv_resp(conn, ftpcode);
      break;

    case FTP_PORT:
      result = ftp_state_port_resp(conn, ftpcode);
      break;

    case FTP_LIST:
    case FTP_RETR:
      result = ftp_state_get_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_STOR:
      result = ftp_state_stor_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, FTP_STOP);
      break;
    }
  } /* if(ftpcode) */

  return result;
}